

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::SetAuxBailOutKind(Instr *this,BailOutKind bailOutKind)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BailOutKind bailOutKind_local;
  Instr *this_local;
  
  IVar1 = this->m_kind;
  if (IVar1 == InstrKindInstr) {
    this[1].bailOutByteCodeLocation = bailOutKind;
  }
  else if (IVar1 == InstrKindBranch) {
    *(BailOutKind *)((long)&this[1].globOptInstrString + 4) = bailOutKind;
  }
  else if (IVar1 == InstrKindProfiled) {
    *(BailOutKind *)((long)&this[1].m_next + 4) = bailOutKind;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x4c3,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void Instr::SetAuxBailOutKind(const IR::BailOutKind bailOutKind)
{
    switch (this->m_kind)
    {
    case InstrKindInstr:
        ((BailOutInstr *)this)->auxBailOutKind = bailOutKind;
        break;
    case InstrKindProfiled:
        ((ProfiledBailOutInstr *)this)->auxBailOutKind = bailOutKind;
        break;
    case InstrKindBranch:
        ((BranchBailOutInstr *)this)->auxBailOutKind = bailOutKind;
        break;
    default:
        Assert(false);
        __assume(false);
    }
}